

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjLoader.cpp
# Opt level: O3

void __thiscall ObjLoader::saveBinaryFile(ObjLoader *this,string *filename)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  uchar *puVar2;
  pointer pSVar3;
  ObjLoader *pOVar4;
  Image<unsigned_char> *pIVar5;
  IBO *ibo;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v;
  SimpleMaterial *material;
  pointer pSVar6;
  char *__end;
  string *name;
  pointer name_00;
  unsigned_long value;
  int32 c;
  int32 d;
  int32 h;
  uint64_t count;
  int32 w;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  textureImageNames;
  ofstream file;
  long *local_290;
  float local_288;
  undefined4 uStack_284;
  long local_280 [2];
  int local_26c;
  int local_268;
  int local_264;
  long *local_260;
  int local_254;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  ObjLoader *local_238;
  long local_230;
  filebuf local_228 [240];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,(filename->_M_dataplus)._M_p,_S_out);
  std::ostream::write((char *)&local_230,0x1721f4);
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[VertexPositions]","");
  writeStringLength(CONCAT44(uStack_284,local_288),(ostream *)&local_230);
  std::ostream::write((char *)&local_230,(long)local_290);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  write<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexPositions,(ostream *)&local_230);
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[VertexColors]","");
  writeStringLength(CONCAT44(uStack_284,local_288),(ostream *)&local_230);
  std::ostream::write((char *)&local_230,(long)local_290);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  write<glm::vec<4,float,(glm::qualifier)0>>(&this->m_vertexColors,(ostream *)&local_230);
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[VertexUVs]","");
  writeStringLength(CONCAT44(uStack_284,local_288),(ostream *)&local_230);
  std::ostream::write((char *)&local_230,(long)local_290);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  write<glm::vec<2,float,(glm::qualifier)0>>(&this->m_vertexUVs,(ostream *)&local_230);
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[VertexNormals]","");
  writeStringLength(CONCAT44(uStack_284,local_288),(ostream *)&local_230);
  std::ostream::write((char *)&local_230,(long)local_290);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  write<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexNormals,(ostream *)&local_230);
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[VertexTangents]","");
  writeStringLength(CONCAT44(uStack_284,local_288),(ostream *)&local_230);
  std::ostream::write((char *)&local_230,(long)local_290);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  write<glm::vec<3,float,(glm::qualifier)0>>(&this->m_vertexTangents,(ostream *)&local_230);
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[IBOS]","");
  writeStringLength(CONCAT44(uStack_284,local_288),(ostream *)&local_230);
  std::ostream::write((char *)&local_230,(long)local_290);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  local_290 = (long *)(((long)(this->m_ibos).
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_ibos).
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)
  ;
  local_260 = local_290;
  swapEndianness((uint64_t *)&local_290);
  std::ostream::write((char *)&local_230,(long)&local_260);
  v = (this->m_ibos).
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (this->m_ibos).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (v != pvVar1) {
    do {
      write<unsigned_int>(v,(ostream *)&local_230);
      v = v + 1;
    } while (v != pvVar1);
  }
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[NamedTextureImages]","");
  writeStringLength(CONCAT44(uStack_284,local_288),(ostream *)&local_230);
  std::ostream::write((char *)&local_230,(long)local_290);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  NamedTextureImages::names_abi_cxx11_(&local_250,&this->m_images);
  local_290 = (long *)((long)local_250.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_250.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_260 = local_290;
  swapEndianness((uint64_t *)&local_290);
  std::ostream::write((char *)&local_230,(long)&local_260);
  local_238 = this;
  if (local_250.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_250.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    name_00 = local_250.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_290 = local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"_Image_","");
      writeStringLength(CONCAT44(uStack_284,local_288),(ostream *)&local_230);
      std::ostream::write((char *)&local_230,(long)local_290);
      if (local_290 != local_280) {
        operator_delete(local_290,local_280[0] + 1);
      }
      writeStringLength(name_00->_M_string_length,(ostream *)&local_230);
      std::ostream::write((char *)&local_230,(long)(name_00->_M_dataplus)._M_p);
      pIVar5 = NamedTextureImages::operator[](&this->m_images,name_00);
      local_254 = pIVar5->width;
      local_264 = pIVar5->height;
      local_268 = pIVar5->depth;
      local_26c = pIVar5->channels;
      puVar2 = pIVar5->data;
      local_290._0_4_ = local_254;
      swapEndianness((int32 *)&local_290);
      std::ostream::write((char *)&local_230,(long)&local_254);
      local_290._0_4_ = local_264;
      swapEndianness((int32 *)&local_290);
      std::ostream::write((char *)&local_230,(long)&local_264);
      local_290._0_4_ = local_268;
      swapEndianness((int32 *)&local_290);
      std::ostream::write((char *)&local_230,(long)&local_268);
      local_290 = (long *)CONCAT44(local_290._4_4_,local_26c);
      swapEndianness((int32 *)&local_290);
      std::ostream::write((char *)&local_230,(long)&local_26c);
      std::ostream::write((char *)&local_230,(long)puVar2);
      name_00 = name_00 + 1;
    } while (name_00 !=
             local_250.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"[SimpleMaterials]","");
  writeStringLength(CONCAT44(uStack_284,local_288),(ostream *)&local_230);
  pOVar4 = local_238;
  std::ostream::write((char *)&local_230,(long)local_290);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  local_290 = (long *)(((long)(pOVar4->m_materials).
                              super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)(pOVar4->m_materials).
                              super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>.
                              _M_impl.super__Vector_impl_data._M_start >> 3) * -0x30c30c30c30c30c3);
  local_260 = local_290;
  swapEndianness((uint64_t *)&local_290);
  std::ostream::write((char *)&local_230,(long)&local_260);
  pSVar6 = (pOVar4->m_materials).super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar3 = (pOVar4->m_materials).super__Vector_base<SimpleMaterial,_std::allocator<SimpleMaterial>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar6 != pSVar3) {
    do {
      local_290 = local_280;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"_Material_","");
      writeStringLength(CONCAT44(uStack_284,local_288),(ostream *)&local_230);
      std::ostream::write((char *)&local_230,(long)local_290);
      if (local_290 != local_280) {
        operator_delete(local_290,local_280[0] + 1);
      }
      writeStringLength((pSVar6->name)._M_string_length,(ostream *)&local_230);
      std::ostream::write((char *)&local_230,(long)(pSVar6->name)._M_dataplus._M_p);
      local_288 = (pSVar6->ambient).field_0.field_0.z;
      local_290 = *(long **)&(pSVar6->ambient).field_0;
      swapEndianness((vec3 *)&local_290);
      std::ostream::write((char *)&local_230,(long)&pSVar6->ambient);
      local_288 = (pSVar6->diffuse).field_0.field_0.z;
      local_290 = *(long **)&(pSVar6->diffuse).field_0;
      swapEndianness((vec3 *)&local_290);
      std::ostream::write((char *)&local_230,(long)&pSVar6->diffuse);
      local_288 = (pSVar6->specular).field_0.field_0.z;
      local_290 = *(long **)&(pSVar6->specular).field_0;
      swapEndianness((vec3 *)&local_290);
      std::ostream::write((char *)&local_230,(long)&pSVar6->specular);
      local_290 = (long *)CONCAT44(local_290._4_4_,pSVar6->shininess);
      swapEndianness((float32 *)&local_290);
      std::ostream::write((char *)&local_230,(long)&pSVar6->shininess);
      writeStringLength((pSVar6->diffuseTexName)._M_string_length,(ostream *)&local_230);
      std::ostream::write((char *)&local_230,(long)(pSVar6->diffuseTexName)._M_dataplus._M_p);
      writeStringLength((pSVar6->normalTexName)._M_string_length,(ostream *)&local_230);
      std::ostream::write((char *)&local_230,(long)(pSVar6->normalTexName)._M_dataplus._M_p);
      writeStringLength((pSVar6->specularTexName)._M_string_length,(ostream *)&local_230);
      std::ostream::write((char *)&local_230,(long)(pSVar6->specularTexName)._M_dataplus._M_p);
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != pSVar3);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_250);
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _XrmGetResource;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void ObjLoader::saveBinaryFile(const std::string & filename) const
{
#define GLITTER_BINFILE_MAGIC "GLITTER_BIN_OBJ\n"
  std::ofstream file(filename.c_str());
  file.write(GLITTER_BINFILE_MAGIC, strlen(GLITTER_BINFILE_MAGIC));

  write(std::string("[VertexPositions]"), file);
  write(m_vertexPositions, file);
  write(std::string("[VertexColors]"), file);
  write(m_vertexColors, file);
  write(std::string("[VertexUVs]"), file);
  write(m_vertexUVs, file);
  write(std::string("[VertexNormals]"), file);
  write(m_vertexNormals, file);
  write(std::string("[VertexTangents]"), file);
  write(m_vertexTangents, file);

  write(std::string("[IBOS]"), file);
  // IBOs
  std::uint64_t count = m_ibos.size();
  write(count, file);
  for (const IBO & ibo : m_ibos) {
    write(ibo, file);
  }

  write(std::string("[NamedTextureImages]"), file);
  // NamedTextureImages m_images;
  std::vector<std::string> textureImageNames = m_images.names();
  count = textureImageNames.size();
  write(count, file);
  for (const std::string & name : textureImageNames) {
    write(std::string("_Image_"), file);
    write(name, file);
    Image<> image = m_images[name];
    glm::int32 w = image.width;
    glm::int32 h = image.height;
    glm::int32 d = image.depth;
    glm::int32 c = image.channels;
    write(w, file);
    write(h, file);
    write(d, file);
    write(c, file);
    file.write(reinterpret_cast<const char *>(image.data), w * h * d * c);
  }

  write(std::string("[SimpleMaterials]"), file);
  // std::vector<SimpleMaterial> m_materials;
  count = m_materials.size();
  write(count, file);
  for (const SimpleMaterial & material : m_materials) {
    write(std::string("_Material_"), file);
    write(material.name, file);
    write(material.ambient, file);
    write(material.diffuse, file);
    write(material.specular, file);
    write(material.shininess, file);
    write(material.diffuseTexName, file);
    write(material.normalTexName, file);
    write(material.specularTexName, file);
  }
}